

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void * la_xrealloc(void *ptr,size_t size,char *file,int line,char *func)

{
  FILE *__stream;
  void *pvVar1;
  int *piVar2;
  char *pcVar3;
  uint in_ECX;
  undefined8 in_RDX;
  size_t in_RSI;
  void *in_RDI;
  undefined8 in_R8;
  
  pvVar1 = realloc(in_RDI,in_RSI);
  __stream = _stderr;
  if (pvVar1 == (void *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"%s:%d: %s(): realloc(%zu) failed: %s\n",in_RDX,(ulong)in_ECX,in_R8,in_RSI,
            pcVar3);
    _exit(1);
  }
  return pvVar1;
}

Assistant:

void *la_xrealloc(void *ptr, size_t size, char const *file, int line, char const *func) {
	ptr = realloc(ptr, size);
	if(ptr == NULL) {
		fprintf(stderr, "%s:%d: %s(): realloc(%zu) failed: %s\n",
				file, line, func, size, strerror(errno));
		_exit(1);
	}
	return ptr;
}